

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

btScalar gjkepa2_impl::GJK::projectorigin(btVector3 *a,btVector3 *b,btScalar *w,U *m)

{
  float fVar1;
  btScalar bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar3 = b->m_floats[0] - a->m_floats[0];
  fVar4 = b->m_floats[1] - a->m_floats[1];
  fVar1 = b->m_floats[2] - a->m_floats[2];
  fVar5 = fVar1 * fVar1 + fVar3 * fVar3 + fVar4 * fVar4;
  if (0.0 < fVar5) {
    fVar5 = -(a->m_floats[2] * fVar1 + a->m_floats[0] * fVar3 + a->m_floats[1] * fVar4) / fVar5;
    if (1.0 <= fVar5) {
      w[0] = 0.0;
      w[1] = 1.0;
      *m = 2;
      fVar1 = b->m_floats[0] * b->m_floats[0] + b->m_floats[1] * b->m_floats[1];
      bVar2 = b->m_floats[2];
    }
    else if (fVar5 <= 0.0) {
      w[0] = 1.0;
      w[1] = 0.0;
      *m = 1;
      fVar1 = a->m_floats[0] * a->m_floats[0] + a->m_floats[1] * a->m_floats[1];
      bVar2 = a->m_floats[2];
    }
    else {
      w[1] = fVar5;
      *w = 1.0 - fVar5;
      *m = 3;
      fVar3 = fVar3 * fVar5 + a->m_floats[0];
      fVar4 = fVar4 * fVar5 + a->m_floats[1];
      bVar2 = fVar1 * fVar5 + a->m_floats[2];
      fVar1 = fVar3 * fVar3 + fVar4 * fVar4;
    }
    return bVar2 * bVar2 + fVar1;
  }
  return -1.0;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)  && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(
			v1.m_floats[0] - v2.m_floats[0],
			v1.m_floats[1] - v2.m_floats[1],
			v1.m_floats[2] - v2.m_floats[2]);
#endif
}